

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O2

bool __thiscall
pktalloc::LightVector<SiameseOriginalPacket,_25U>::SetSize_NoCopy
          (LightVector<SiameseOriginalPacket,_25U> *this,uint elements)

{
  LightVector<SiameseOriginalPacket,_25U> *pLVar1;
  SiameseOriginalPacket *pSVar2;
  uint uVar3;
  
  if (this->Allocated < elements) {
    uVar3 = elements * 3 >> 1;
    pSVar2 = (SiameseOriginalPacket *)operator_new__((ulong)uVar3 << 4,(nothrow_t *)&std::nothrow);
    if (pSVar2 == (SiameseOriginalPacket *)0x0) {
      return false;
    }
    pLVar1 = (LightVector<SiameseOriginalPacket,_25U> *)this->DataPtr;
    this->Allocated = uVar3;
    this->DataPtr = pSVar2;
    if (pLVar1 != (LightVector<SiameseOriginalPacket,_25U> *)0x0 && pLVar1 != this) {
      operator_delete__(pLVar1);
    }
  }
  this->Size = elements;
  return true;
}

Assistant:

bool SetSize_NoCopy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData)
                return false;
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Delete old data without copying
            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }